

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FILE *pFVar6;
  char *pcVar7;
  int iVar8;
  pointer pcVar9;
  char *pcVar10;
  ulong uVar11;
  Lit *pLVar12;
  long lVar13;
  ushort in_FPUControlWord;
  double dVar14;
  double dVar15;
  size_t __size;
  int argc_local;
  int iVar16;
  fpu_control_t newcw;
  fpu_control_t oldcw;
  lbool ret;
  StringOption drup_file;
  StringOption dimacs;
  StringOption pcs_file;
  IntOption cpu_lim;
  BoolOption drup;
  BoolOption s_model;
  BoolOption pre;
  IntOption mem_lim;
  IntOption verb;
  SimpSolver S;
  long in_stack_ffffffffffefeaa0;
  FILE *__stream;
  char in_stack_ffffffffffefecc0;
  uint in_stack_ffffffffffefecd0;
  uint in_stack_ffffffffffefee10;
  vec<Minisat::Lit> dummy;
  int iStack_40;
  int iStack_3c;
  
  argc_local = argc;
  Minisat::setUsageHelp
            (
            "USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n"
            );
  puts("c This is MergeSAT (simp).");
  newcw = in_FPUControlWord & 0xfcff | 0x200;
  puts("c WARNING: for repeatability, setting FPU to use double precision");
  Minisat::IntOption::IntOption
            (&verb,"MAIN","verb","Verbosity level (0=silent, 1=some, 2=more).",1,
             (IntRange)0x400000000,false,(Option *)0x0);
  Minisat::BoolOption::BoolOption
            (&pre,"MAIN","pre","Completely turn on/off any preprocessing.",true,false,(Option *)0x0)
  ;
  Minisat::BoolOption::BoolOption
            (&s_model,"MAIN","model","Do report a model if the formula is satisfiable.",true,false,
             (Option *)0x0);
  Minisat::StringOption::StringOption
            (&dimacs,"MAIN","dimacs",
             "If given, stop after preprocessing and write the result to this file.",(char *)0x0,
             false,(Option *)0x0);
  Minisat::IntOption::IntOption
            (&cpu_lim,"MAIN","cpu-lim","Limit on CPU time allowed in seconds.\n",0x7fffffff,
             (IntRange)0x7fffffff00000000,false,(Option *)0x0);
  Minisat::IntOption::IntOption
            (&mem_lim,"MAIN","mem-lim","Limit on memory usage in megabytes.\n",0x7fffffff,
             (IntRange)0x7fffffff00000000,false,(Option *)0x0);
  Minisat::BoolOption::BoolOption
            (&drup,"MAIN","drup","Generate DRUP UNSAT proof.",false,false,(Option *)0x0);
  Minisat::StringOption::StringOption
            (&drup_file,"MAIN","drup-file","DRUP UNSAT proof ouput file.","",false,(Option *)0x0);
  Minisat::StringOption::StringOption
            (&pcs_file,"MAIN","pcs-file","Print solver parameter configuration to this file.","",
             false,(Option *)0x0);
  Minisat::parseOptions(&argc_local,argv,true);
  if ((pcs_file.value != (string *)0x0) && ((pcs_file.value)->_M_string_length != 0)) {
    print_pcs_file(((pcs_file.value)->_M_dataplus)._M_p);
  }
  Minisat::SimpSolver::SimpSolver(&S);
  dVar14 = Minisat::cpuTime();
  if (pre.value == false) {
    Minisat::SimpSolver::eliminate(SUB81(&S,0));
  }
  __stream = (FILE *)0x0;
  pcVar10 = ((drup_file.value)->_M_dataplus)._M_p;
  cVar1 = *pcVar10;
  if (drup.value == false) {
    if (cVar1 == '\0') goto LAB_00106abc;
LAB_00106a2d:
    __stream = fopen(pcVar10,"wb");
  }
  else {
    __stream = _stdout;
    if (cVar1 != '\0') goto LAB_00106a2d;
  }
  pFVar6 = _stdout;
  if (__stream == (FILE *)0x0) {
    if (drup_file.value == (string *)0x0) {
      pcVar9 = (pointer)0x0;
    }
    else {
      pcVar9 = ((drup_file.value)->_M_dataplus)._M_p;
    }
    printf("c Error opening %s for write.\n",pcVar9);
    __stream = pFVar6;
  }
  if (__stream == _stdout) {
    pcVar10 = "stdout";
  }
  else if (drup_file.value == (string *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    pcVar10 = ((drup_file.value)->_M_dataplus)._M_p;
  }
  printf("c DRUP proof generation: %s\n",pcVar10);
LAB_00106abc:
  solver = (Solver *)&S;
  signal(2,SIGINT_exit);
  signal(0xf,SIGINT_exit);
  signal(0x18,SIGINT_exit);
  if (cpu_lim.value != 0x7fffffff) {
    getrlimit(RLIMIT_CPU,(rlimit *)&dummy);
    if (((Lit *)(long)cpu_lim.value < (ulong)dummy._8_8_ || dummy._8_8_ == -1) &&
       (dummy.data = (Lit *)(long)cpu_lim.value, iVar3 = setrlimit(RLIMIT_CPU,(rlimit *)&dummy),
       iVar3 == -1)) {
      puts("c WARNING! Could not set resource limit: CPU-time.");
    }
  }
  if ((long)mem_lim.value != 0x7fffffff) {
    pLVar12 = (Lit *)((long)mem_lim.value << 0x14);
    getrlimit(RLIMIT_AS,(rlimit *)&dummy);
    if (((dummy._8_8_ == -1) || (pLVar12 < (ulong)dummy._8_8_)) &&
       (dummy.data = pLVar12, iVar3 = setrlimit(RLIMIT_AS,(rlimit *)&dummy), iVar3 == -1)) {
      puts("c WARNING! Could not set resource limit: Virtual memory.");
    }
  }
  if ((argc_local != 1) ||
     (puts("c Reading from standard input... Use \'--help\' for help."), pFVar6 = _stdin,
     argc_local != 1)) {
    pFVar6 = (FILE *)Minisat::open_to_read_file(argv[1]);
  }
  if (pFVar6 == (FILE *)0x0) {
    if (argc_local == 1) {
      pcVar10 = "<stdin>";
    }
    else {
      pcVar10 = argv[1];
    }
    printf("c ERROR! Could not open file: %s\n",pcVar10);
    iVar3 = 1;
  }
  else {
    if (0 < verb.value) {
      puts("c ============================[ Problem Statistics ]=============================");
      puts("c |                                                                             |");
    }
    Minisat::StreamBuffer::StreamBuffer((StreamBuffer *)&dummy,(FILE *)pFVar6);
    iVar3 = 0;
    iVar16 = 0;
    uVar5 = 0;
LAB_00106c6d:
    Minisat::skipWhitespace<Minisat::StreamBuffer>((StreamBuffer *)&dummy);
    if (iStack_40 < iStack_3c) {
      cVar1 = *(char *)((long)&dummy.sz + (long)iStack_40);
      bVar2 = SUB81((Solver *)&S,0);
      if (cVar1 == 'p') {
        lVar13 = 0;
        while( true ) {
          if (lVar13 == 5) break;
          uVar5 = 0xffffffff;
          if (iStack_40 < iStack_3c) {
            uVar5 = (uint)*(byte *)((long)&dummy.sz + (long)iStack_40);
          }
          if (uVar5 != (int)"p cnf"[lVar13]) break;
          lVar13 = lVar13 + 1;
          Minisat::StreamBuffer::operator++((StreamBuffer *)&dummy);
        }
        if ("p cnf"[lVar13] != '\0') {
          if (iStack_40 < iStack_3c) {
            uVar11 = (ulong)*(byte *)((long)&dummy.sz + (long)iStack_40);
          }
          else {
            uVar11 = 0xffffffffffffffff;
          }
          printf("PARSE ERROR! Unexpected char: %c\n",uVar11);
          iVar3 = 3;
          goto LAB_00106df4;
        }
        uVar5 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&dummy);
        iVar16 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&dummy);
        iVar4 = Minisat::SimpSolver::max_simp_cls();
        if (iVar4 < iVar16) {
          Minisat::SimpSolver::eliminate(bVar2);
        }
        Minisat::SimpSolver::reserveVars((int)(Solver *)&S);
      }
      else if (cVar1 == 'c') {
        do {
          if (iStack_3c <= iStack_40) break;
          cVar1 = *(char *)((long)&dummy.sz + (long)iStack_40);
          Minisat::StreamBuffer::operator++((StreamBuffer *)&dummy);
        } while (cVar1 != '\n');
      }
      else {
        iVar3 = iVar3 + 1;
        while (iVar4 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&dummy), iVar4 != 0)
        {
          iVar8 = -iVar4;
          if (0 < iVar4) {
            iVar8 = iVar4;
          }
          while ((int)in_stack_ffffffffffefee10 < iVar8) {
            Minisat::SimpSolver::newVar(bVar2,true);
          }
          Minisat::vec<Minisat::Lit>::push
                    ((vec<Minisat::Lit> *)&ret,(Lit *)&stack0xffffffffffefe854);
        }
        Minisat::Solver::addInputClause_((Solver *)&S,(vec<Minisat::Lit> *)&ret);
        Minisat::SimpSolver::addClause_((vec *)&S);
      }
      goto LAB_00106c6d;
    }
    if (uVar5 != in_stack_ffffffffffefee10) {
      fwrite("c WARNING! DIMACS header mismatch: wrong number of variables.\n",0x3e,1,_stderr);
    }
    if (iVar3 != iVar16) {
      fwrite("c WARNING! DIMACS header mismatch: wrong number of clauses.\n",0x3c,1,_stderr);
    }
    Minisat::vec<Minisat::Lit>::~vec((vec<Minisat::Lit> *)&ret);
    fclose(pFVar6);
    if (argc_local < 3) {
      pFVar6 = (FILE *)0x0;
    }
    else {
      pFVar6 = fopen(argv[2],"wb");
    }
    if (0 < verb.value) {
      printf("c |  Number of variables:  %12d                                         |\n",
             (ulong)in_stack_ffffffffffefee10);
      printf("c |  Number of clauses:    %12d                                         |\n",
             (ulong)in_stack_ffffffffffefecd0);
    }
    dVar15 = Minisat::cpuTime();
    if (0 < verb.value) {
      printf("c |  Parse time:           %12.2f s                                       |\n",
             dVar15 - dVar14);
    }
    signal(2,default_signal_handler);
    signal(0xf,default_signal_handler);
    signal(0x18,default_signal_handler);
    signal(0xb,default_signal_handler);
    Minisat::SimpSolver::eliminate(SUB81(&S,0));
    dVar14 = Minisat::cpuTime();
    if (0 < verb.value) {
      printf("c |  Simplification time:  %12.2f s                                       |\n",
             dVar14 - dVar15);
      puts("c |                                                                             |");
    }
    if (in_stack_ffffffffffefecc0 != '\0') {
      if ((dimacs.value != (string *)0x0) && (((dimacs.value)->_M_dataplus)._M_p != (pointer)0x0)) {
        if ((verb.value < 1) ||
           (puts("c ==============================[ Writing DIMACS ]==============================="
                ), dimacs.value != (string *)0x0)) {
          pcVar10 = ((dimacs.value)->_M_dataplus)._M_p;
        }
        else {
          pcVar10 = (char *)0x0;
        }
        Minisat::Solver::toDimacs((Solver *)&S,pcVar10);
        if (0 < verb.value) {
          (**(code **)(_S + 0x18))();
        }
        exit(0);
      }
      dummy.data = (Lit *)0x0;
      dummy.sz = 0;
      dummy.cap = 0;
      Minisat::SimpSolver::solveLimited(&S,&dummy,true,false);
      if (0 < verb.value) {
        (**(code **)(_S + 0x18))();
        putchar(10);
      }
      bVar2 = Minisat::lbool::operator==(&ret,(lbool)0x0);
      if (bVar2) {
        pcVar10 = "s SATISFIABLE\n";
      }
      else {
        bVar2 = Minisat::lbool::operator==(&ret,(lbool)0x1);
        pcVar10 = "s UNKNOWN\n";
        if (bVar2) {
          pcVar10 = "s UNSATISFIABLE\n";
        }
      }
      printf(pcVar10);
      bVar2 = Minisat::lbool::operator==(&ret,(lbool)0x0);
      if ((bVar2) && (s_model.value == true)) {
        printf("v ");
        uVar11 = 0;
        while ((long)uVar11 < (long)(int)in_stack_ffffffffffefee10) {
          bVar2 = Minisat::lbool::operator!=
                            ((lbool *)(in_stack_ffffffffffefeaa0 + uVar11),(lbool)0x2);
          if (bVar2) {
            pcVar10 = " ";
            if (uVar11 == 0) {
              pcVar10 = "";
            }
            bVar2 = Minisat::lbool::operator==
                              ((lbool *)(in_stack_ffffffffffefeaa0 + uVar11),(lbool)0x0);
            pcVar7 = "-";
            if (bVar2) {
              pcVar7 = "";
            }
            uVar11 = uVar11 + 1;
            printf("%s%s%d",pcVar10,pcVar7,uVar11 & 0xffffffff);
          }
          else {
            uVar11 = uVar11 + 1;
          }
        }
        puts(" 0");
      }
      if (__stream == (FILE *)0x0) {
        __stream = (FILE *)0x0;
      }
      else {
        bVar2 = Minisat::lbool::operator==(&ret,(lbool)0x1);
        if (bVar2) {
          fputc(0x61,__stream);
          fputc(0,__stream);
        }
      }
      if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
        fclose(__stream);
      }
      if (pFVar6 != (FILE *)0x0) {
        bVar2 = Minisat::lbool::operator==(&ret,(lbool)0x0);
        if (bVar2) {
          fwrite("s SATISFIABLE\nv ",0x10,1,pFVar6);
          uVar11 = 0;
          while ((long)uVar11 < (long)(int)in_stack_ffffffffffefee10) {
            bVar2 = Minisat::lbool::operator!=
                              ((lbool *)(in_stack_ffffffffffefeaa0 + uVar11),(lbool)0x2);
            if (bVar2) {
              pcVar10 = " ";
              if (uVar11 == 0) {
                pcVar10 = "";
              }
              bVar2 = Minisat::lbool::operator==
                                ((lbool *)(in_stack_ffffffffffefeaa0 + uVar11),(lbool)0x0);
              pcVar7 = "-";
              if (bVar2) {
                pcVar7 = "";
              }
              uVar11 = uVar11 + 1;
              fprintf(pFVar6,"%s%s%d",pcVar10,pcVar7,uVar11 & 0xffffffff);
            }
            else {
              uVar11 = uVar11 + 1;
            }
          }
          pcVar10 = " 0\n";
          __size = 3;
        }
        else {
          bVar2 = Minisat::lbool::operator==(&ret,(lbool)0x1);
          if (bVar2) {
            pcVar10 = "s UNSATISFIABLE\n";
            __size = 0x10;
          }
          else {
            pcVar10 = "s UNKNOWN\n";
            __size = 10;
          }
        }
        fwrite(pcVar10,__size,1,pFVar6);
        fclose(pFVar6);
      }
      bVar2 = Minisat::lbool::operator==(&ret,(lbool)0x0);
      if (bVar2) {
        iVar3 = 10;
      }
      else {
        bVar2 = Minisat::lbool::operator==(&ret,(lbool)0x1);
        iVar3 = 0;
        if (bVar2) {
          iVar3 = 0x14;
        }
      }
      exit(iVar3);
    }
    if (pFVar6 != (FILE *)0x0) {
      fwrite("s UNSATISFIABLE\n",0x10,1,pFVar6);
      fclose(pFVar6);
    }
    if (0 < verb.value) {
      puts("c ===============================================================================");
      puts("c Solved by simplification");
      (**(code **)(_S + 0x18))();
      putchar(10);
    }
    puts("s UNSATISFIABLE");
    if (__stream == (FILE *)0x0) {
      __stream = (FILE *)0x0;
    }
    else {
      dummy.data = (Lit *)0x0;
      dummy.sz = 0;
      dummy.cap = 0;
      Minisat::Solver::binDRUP<Minisat::vec<Minisat::Lit>>((Solver *)&S,'a',&dummy,(FILE *)__stream)
      ;
      Minisat::vec<Minisat::Lit>::~vec(&dummy);
    }
    if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
      fclose(__stream);
    }
    iVar3 = 0x14;
  }
LAB_00106df4:
  exit(iVar3);
}

Assistant:

int main(int argc, char **argv)
{
    try {
        setUsageHelp("USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or "
                     "gzipped DIMACS.\n");
        printf("c This is MergeSAT (simp).\n");

#if defined(__linux__)
        fpu_control_t oldcw, newcw;
        _FPU_GETCW(oldcw);
        newcw = (oldcw & ~_FPU_EXTENDED) | _FPU_DOUBLE;
        _FPU_SETCW(newcw);
        printf("c WARNING: for repeatability, setting FPU to use double precision\n");
#endif
        // Extra options:
        //
        IntOption verb("MAIN", "verb", "Verbosity level (0=silent, 1=some, 2=more).", 1, IntRange(0, 4), false);
        BoolOption pre("MAIN", "pre", "Completely turn on/off any preprocessing.", true);
        BoolOption s_model("MAIN", "model", "Do report a model if the formula is satisfiable.", true, false);
        StringOption dimacs("MAIN", "dimacs", "If given, stop after preprocessing and write the result to this file.");
        IntOption cpu_lim("MAIN", "cpu-lim", "Limit on CPU time allowed in seconds.\n", INT32_MAX, IntRange(0, INT32_MAX), false);
        IntOption mem_lim("MAIN", "mem-lim", "Limit on memory usage in megabytes.\n", INT32_MAX, IntRange(0, INT32_MAX), false);
        BoolOption drup("MAIN", "drup", "Generate DRUP UNSAT proof.", false, false);
        StringOption drup_file("MAIN", "drup-file", "DRUP UNSAT proof ouput file.", "");
        StringOption pcs_file("MAIN", "pcs-file", "Print solver parameter configuration to this file.", "");

        parseOptions(argc, argv, true);

        if (!pcs_file.is_empty()) print_pcs_file(pcs_file);

        SimpSolver S;
        double initial_time = cpuTime();

        if (!pre) S.eliminate(true);

        S.parsing = true;
        S.verbosity = verb;
        S.drup_file = NULL;
        if (drup || strlen(drup_file)) {
            S.drup_file = strlen(drup_file) ? fopen(drup_file, "wb") : stdout;
            if (S.drup_file == NULL) {
                S.drup_file = stdout;
                printf("c Error opening %s for write.\n", (const char *)drup_file);
            }
            printf("c DRUP proof generation: %s\n", S.drup_file == stdout ? "stdout" : drup_file);
        }

        solver = &S;
        // Use signal handlers that forcibly quit until the solver will be able to respond to
        // interrupts:
        signal(SIGINT, SIGINT_exit);
        signal(SIGTERM, SIGINT_exit);
        signal(SIGXCPU, SIGINT_exit);

        // Set limit on CPU-time:
        if (cpu_lim != INT32_MAX) {
            rlimit rl;
            getrlimit(RLIMIT_CPU, &rl);
            if (rl.rlim_max == RLIM_INFINITY || (rlim_t)cpu_lim < rl.rlim_max) {
                rl.rlim_cur = cpu_lim;
                if (setrlimit(RLIMIT_CPU, &rl) == -1) printf("c WARNING! Could not set resource limit: CPU-time.\n");
            }
        }

        // Set limit on virtual memory:
        if (mem_lim != INT32_MAX) {
            rlim_t new_mem_lim = (rlim_t)mem_lim * 1024 * 1024;
            rlimit rl;
            getrlimit(RLIMIT_AS, &rl);
            if (rl.rlim_max == RLIM_INFINITY || new_mem_lim < rl.rlim_max) {
                rl.rlim_cur = new_mem_lim;
                if (setrlimit(RLIMIT_AS, &rl) == -1)
                    printf("c WARNING! Could not set resource limit: Virtual memory.\n");
            }
        }

        if (argc == 1) printf("c Reading from standard input... Use '--help' for help.\n");

#ifdef USE_LIBZ
        gzFile in = (argc == 1) ? gzdopen(0, "rb") : gzopen(argv[1], "rb");
#else
        FILE *in = (argc == 1) ? stdin : open_to_read_file(argv[1]);
#endif
        if (in == NULL) printf("c ERROR! Could not open file: %s\n", argc == 1 ? "<stdin>" : argv[1]), exit(1);

        if (S.verbosity > 0) {
            printf("c ============================[ Problem Statistics ]=============================\n");
            printf("c |                                                                             |\n");
        }

        parse_DIMACS(in, S);
        fclose(in);
        FILE *res = (argc >= 3) ? fopen(argv[2], "wb") : NULL;

        if (S.verbosity > 0) {
            printf("c |  Number of variables:  %12d                                         |\n", S.nVars());
            printf("c |  Number of clauses:    %12d                                         |\n", S.nClauses());
        }

        double parsed_time = cpuTime();
        if (S.verbosity > 0)
            printf("c |  Parse time:           %12.2f s                                       |\n", parsed_time - initial_time);

        // Change to signal-handlers that will only notify the solver and allow it to terminate
        // voluntarily:
        signal(SIGINT, default_signal_handler);
        signal(SIGTERM, default_signal_handler);
        signal(SIGXCPU, default_signal_handler);
        signal(SIGSEGV, default_signal_handler); /* we still want to understand the state */

        S.parsing = false;
        S.eliminate(true);
        double simplified_time = cpuTime();
        if (S.verbosity > 0) {
            printf("c |  Simplification time:  %12.2f s                                       |\n", simplified_time - parsed_time);
            printf("c |                                                                             |\n");
        }

        if (!S.okay()) {
            if (res != NULL) fprintf(res, "s UNSATISFIABLE\n"), fclose(res);
            if (S.verbosity > 0) {
                printf("c ===============================================================================\n");
                printf("c Solved by simplification\n");
                printStats(S);
                printf("\n");
            }
            printf("s UNSATISFIABLE\n");
            if (S.drup_file) {
#ifdef BIN_DRUP
                S.binDRUP('a', vec<Lit>(), S.drup_file);
#else
                fprintf(S.drup_file, "0\n");
#endif
            }
            if (S.drup_file && S.drup_file != stdout) fclose(S.drup_file);
            exit(20);
        }

        if (dimacs) {
            if (S.verbosity > 0)
                printf("c ==============================[ Writing DIMACS ]===============================\n");
            S.toDimacs((const char *)dimacs);
            if (S.verbosity > 0) printStats(S);
            exit(0);
        }

        vec<Lit> dummy;
        lbool ret = S.solveLimited(dummy);

        if (S.verbosity > 0) {
            printStats(S);
            printf("\n");
        }
        printf(ret == l_True ? "s SATISFIABLE\n" : ret == l_False ? "s UNSATISFIABLE\n" : "s UNKNOWN\n");
        if (ret == l_True && s_model) {
            printf("v ");
            for (int i = 0; i < S.nVars(); i++)
                if (S.model[i] != l_Undef)
                    printf("%s%s%d", (i == 0) ? "" : " ", (S.model[i] == l_True) ? "" : "-", i + 1);
            printf(" 0\n");
        }


        if (S.drup_file && ret == l_False) {
#ifdef BIN_DRUP
            fputc('a', S.drup_file);
            fputc(0, S.drup_file);
#else
            fprintf(S.drup_file, "0\n");
#endif
        }
        if (S.drup_file && S.drup_file != stdout) fclose(S.drup_file);

        if (res != NULL) {
            if (ret == l_True) {
                fprintf(res, "s SATISFIABLE\nv ");
                for (int i = 0; i < S.nVars(); i++)
                    if (S.model[i] != l_Undef)
                        fprintf(res, "%s%s%d", (i == 0) ? "" : " ", (S.model[i] == l_True) ? "" : "-", i + 1);
                fprintf(res, " 0\n");
            } else if (ret == l_False)
                fprintf(res, "s UNSATISFIABLE\n");
            else
                fprintf(res, "s UNKNOWN\n");
            fclose(res);
        }

#ifdef NDEBUG
        exit(ret == l_True ? 10 : ret == l_False ? 20 : 0); // (faster than "return", which will invoke the destructor for 'Solver')
#else
        return (ret == l_True ? 10 : ret == l_False ? 20 : 0);
#endif
    } catch (OutOfMemoryException &) {
        printf("c ===============================================================================\n");
        printf("c Out of memory\n");
        printf("s UNKNOWN\n");
        exit(0);
    }
}